

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

void __thiscall
ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(ON_MemoryAllocationTracking *this)

{
  return;
}

Assistant:

ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking()
{
#if defined(ON_DEBUG_MEMORY_MSC_WIN)
  // Dale Lear - Dec 2017
  //   Not thread safe but good enough for now and won't crash or assert.
  //   Relax, it's just a debugging tool based on ancient Microsoft debug heap tools.
  if (ON_MemoryAllocationTracking::m_g_stack_depth > 0)
  {
    const bool bOutOfOrder = (m_this_statck_depth != ON_MemoryAllocationTracking::m_g_stack_depth);

    const int crt_dbg_flag0
      = bOutOfOrder
      ? ON_MemoryAllocationTracking::m_this_crt_dbg_flag0
      : m_this_crt_dbg_flag0;

    const int crt_dbg_flag1 = _CrtSetDbgFlag(_CRTDBG_REPORT_FLAG);

    if ( crt_dbg_flag1 != crt_dbg_flag0 )
    {
      _CrtSetDbgFlag(crt_dbg_flag0);
    }
    ON_MemoryAllocationTracking::m_g_stack_depth--;
  }
#endif
}